

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-proxy.c
# Opt level: O0

char * get_cmd(uchar cmd)

{
  char *pcStack_10;
  uchar cmd_local;
  
  switch(cmd) {
  case 0xec:
    pcStack_10 = "xEOF";
    break;
  case 0xed:
    pcStack_10 = "SUSP";
    break;
  case 0xee:
    pcStack_10 = "ABORT";
    break;
  case 0xef:
    pcStack_10 = "EOR";
    break;
  case 0xf0:
    pcStack_10 = "SE";
    break;
  case 0xf1:
    pcStack_10 = "NOP";
    break;
  case 0xf2:
    pcStack_10 = "DM";
    break;
  case 0xf3:
    pcStack_10 = "BREAK";
    break;
  case 0xf4:
    pcStack_10 = "IP";
    break;
  case 0xf5:
    pcStack_10 = "AO";
    break;
  case 0xf6:
    pcStack_10 = "AYT";
    break;
  case 0xf7:
    pcStack_10 = "EC";
    break;
  case 0xf8:
    pcStack_10 = "EL";
    break;
  case 0xf9:
    pcStack_10 = "GA";
    break;
  case 0xfa:
    pcStack_10 = "SB";
    break;
  case 0xfb:
    pcStack_10 = "WILL";
    break;
  case 0xfc:
    pcStack_10 = "WONT";
    break;
  case 0xfd:
    pcStack_10 = "DO";
    break;
  case 0xfe:
    pcStack_10 = "DONT";
    break;
  case 0xff:
    pcStack_10 = "IAC";
    break;
  default:
    snprintf(get_cmd::buffer,4,"%d",(ulong)cmd);
    pcStack_10 = get_cmd::buffer;
  }
  return pcStack_10;
}

Assistant:

static const char *get_cmd(unsigned char cmd) {
	static char buffer[4];

	switch (cmd) {
	case 255: return "IAC";
	case 254: return "DONT";
	case 253: return "DO";
	case 252: return "WONT";
	case 251: return "WILL";
	case 250: return "SB";
	case 249: return "GA";
	case 248: return "EL";
	case 247: return "EC";
	case 246: return "AYT";
	case 245: return "AO";
	case 244: return "IP";
	case 243: return "BREAK";
	case 242: return "DM";
	case 241: return "NOP";
	case 240: return "SE";
	case 239: return "EOR";
	case 238: return "ABORT";
	case 237: return "SUSP";
	case 236: return "xEOF";
	default:
		snprintf(buffer, sizeof(buffer), "%d", (int)cmd);
		return buffer;
	}
}